

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

void InitVector(Vector *V,int sz)

{
  if (0 < sz) {
    V->ArraySize = sz;
    V->VectorLength = 0;
    GetArray(V);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Invalid Array Size!",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void InitVector(Vector *V,int sz)  //初始化空向量，建立一个最大长度为sz的数组
{
    if(sz <= 0)
        cout << "Invalid Array Size!" << endl;
    else
    {
        V->ArraySize = sz;
        V->VectorLength = 0;
        GetArray(V);
    }
}